

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plotsim.cc
# Opt level: O3

void timCallback(Timer *tim,Simulator *sim,int64_t *t,bool ismain)

{
  uint uVar1;
  uint uVar2;
  _Map_pointer pplVar3;
  _Elt_pointer plVar4;
  _Elt_pointer plVar5;
  int64_t *piVar6;
  stack<long,_std::deque<long,_std::allocator<long>_>_> *psVar7;
  stack<long,_std::deque<long,_std::allocator<long>_>_> *psVar8;
  stack<long,_std::deque<long,_std::allocator<long>_>_> *psVar9;
  stack<long,_std::deque<long,_std::allocator<long>_>_> *psVar10;
  int64_t iVar11;
  long lVar12;
  undefined7 in_register_00000009;
  _Elt_pointer plVar13;
  long lVar14;
  int *piVar15;
  stack<long,_std::deque<long,_std::allocator<long>_>_> *psVar16;
  stack<long,_std::deque<long,_std::allocator<long>_>_> *psVar17;
  stack<long,_std::deque<long,_std::allocator<long>_>_> *this;
  bool bVar18;
  int64_t local_38;
  
  psVar16 = &vt2s;
  bVar18 = (int)CONCAT71(in_register_00000009,ismain) != 0;
  this = &vt2s;
  if (bVar18) {
    this = &vt1s;
  }
  piVar15 = &r2step;
  if (bVar18) {
    piVar15 = &r1step;
  }
  uVar2 = *piVar15;
  uVar1 = uVar2 - 1;
  *piVar15 = uVar1;
  if ((int)uVar2 < 2) {
    tim->isRunning = false;
    *t = 0;
    return;
  }
  psVar17 = &vt2s;
  if (ismain) {
    psVar17 = &vt1s;
  }
  psVar9 = &vt2s;
  if (ismain) {
    psVar9 = &vt1s;
  }
  pplVar3 = *(_Map_pointer *)
             ((long)&(psVar9->c).super__Deque_base<long,_std::allocator<long>_>._M_impl.
                     super__Deque_impl_data._M_finish + 0x18);
  psVar9 = &vt2s;
  if (ismain) {
    psVar9 = &vt1s;
  }
  psVar10 = &vt2s;
  if (ismain) {
    psVar10 = &vt1s;
  }
  psVar8 = &vt2s;
  if (ismain) {
    psVar8 = &vt1s;
  }
  psVar7 = &vt2s;
  if (ismain) {
    psVar7 = &vt1s;
  }
  plVar13 = (psVar17->c).super__Deque_base<long,_std::allocator<long>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  plVar4 = *(_Elt_pointer *)
            ((long)&(psVar10->c).super__Deque_base<long,_std::allocator<long>_>._M_impl.
                    super__Deque_impl_data._M_finish + 8);
  plVar5 = (psVar7->c).super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data
           ._M_start._M_cur;
  if (((long)*(_Elt_pointer *)
              ((long)&(psVar8->c).super__Deque_base<long,_std::allocator<long>_>._M_impl.
                      super__Deque_impl_data._M_start + 0x10) - (long)plVar5 >> 3) +
      ((long)plVar13 - (long)plVar4 >> 3) +
      ((((ulong)((long)pplVar3 -
                (long)*(_Map_pointer *)
                       ((long)&(psVar9->c).super__Deque_base<long,_std::allocator<long>_>._M_impl.
                               super__Deque_impl_data._M_start + 0x18)) >> 3) - 1) +
      (ulong)(pplVar3 == (_Map_pointer)0x0)) * 0x40 < (ulong)uVar1) {
    if (plVar13 != plVar5) {
      if (plVar13 == plVar4) {
        plVar13 = pplVar3[-1] + 0x40;
      }
      lVar14 = (long)sim->MINT;
      if (plVar13[-1] <= (long)sim->MINT) goto LAB_00103abf;
    }
    iVar11 = linearSpeedCurve(sim,*t);
    local_38 = (long)sim->MINT;
    if (sim->MINT < iVar11) {
      local_38 = iVar11;
    }
    if (ismain) {
      psVar16 = &vt1s;
    }
    piVar6 = (psVar17->c).super__Deque_base<long,_std::allocator<long>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar6 == (psVar16->c).super__Deque_base<long,_std::allocator<long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<long,std::allocator<long>>::_M_push_back_aux<long_const&>
                ((deque<long,std::allocator<long>> *)this,&local_38);
      lVar14 = local_38;
    }
    else {
      *piVar6 = local_38;
      (psVar17->c).super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur = piVar6 + 1;
      lVar14 = local_38;
    }
  }
  else {
    if (plVar13 == plVar4) {
      plVar13 = pplVar3[-1] + 0x40;
    }
    lVar14 = plVar13[-1];
    std::deque<long,_std::allocator<long>_>::pop_back(&this->c);
  }
LAB_00103abf:
  lVar12 = (long)((float)lVar14 * tg);
  if (ismain) {
    lVar12 = lVar14;
  }
  tim->period = (uint32_t)lVar12;
  *t = *t + lVar12;
  return;
}

Assistant:

static void timCallback(brown::Timer& tim, brown::Simulator& sim,
                        std::int64_t& t, bool ismain) {
    std::stack<std::int64_t>& vts = ismain ? vt1s : vt2s;
    int& rstep = ismain? r1step : r2step;

    if (--rstep <= 0) {
        tim.stop();
        t = 0; vts.empty();
        return;
    }

    // set next speed interval
    std::int64_t vt = 0;
    if (vts.size() >= rstep) { // decelerate
        vt = vts.top();
        vts.pop();
    } else if (vts.empty() || (vts.top() > sim.MINT)) { // accelerate
        vt = linearSpeedCurve(sim, t);
        if (vt < sim.MINT) { // speeding
            vt = sim.MINT;
        }
        vts.push(vt);
    } else { // hold
        vt = sim.MINT;
    }

    // adjust speed on secondary axis
    if (!ismain) {
        vt *= tg;
    }
    tim.setPeriod(vt);
    t += vt;
}